

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

string * __thiscall
r_comp::Decompiler::get_variable_name_abi_cxx11_
          (string *__return_storage_ptr__,Decompiler *this,uint16_t index,bool postfix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  string s;
  char buffer [255];
  uint16_t local_15a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char local_138 [264];
  
  paVar1 = &local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_15a = index;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  iVar2 = std::
          _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->variable_names)._M_h,&local_15a);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_158,0,(char *)local_158._M_string_length,0x13ecb4);
    this->last_variable_id = this->last_variable_id + 1;
    sprintf(local_138,"%d");
    std::__cxx11::string::append((char *)&local_158);
    pmVar3 = std::__detail::
             _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->variable_names,&local_15a);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    if (postfix) {
      std::__cxx11::string::push_back((char)&local_158);
    }
    OutStream::insert<std::__cxx11::string>(this->out_stream,(ulong)local_15a,&local_158);
    if (postfix) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_158);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                      local_158.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_158.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_158._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                      local_158.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_158._M_string_length;
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      local_158._M_dataplus._M_p = (pointer)paVar1;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               *(long *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x10),
               *(long *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x18) +
               *(long *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x10));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompiler::get_variable_name(uint16_t index, bool postfix)
{
    std::string s;
    std::unordered_map<uint16_t, std::string>::iterator it = variable_names.find(index);

    if (it == variable_names.end()) {
        char buffer[255];
        s = "v";
        sprintf(buffer, "%d", last_variable_id++);
        s += buffer;
        variable_names[index] = s;

        if (postfix) {
            s += ':';
        }

        out_stream->insert(index, s);

        if (postfix) {
            return s.substr(0, s.length() - 1);
        }

        return s;
    }

    return it->second;
}